

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::JsonCodec::Impl::encodeString(String *__return_storage_ptr__,Impl *this,StringPtr chars)

{
  size_t sVar1;
  Array<char> local_120;
  char local_103 [3];
  undefined1 local_100 [7];
  uint8_t c2;
  StringPtr local_f0;
  StringPtr local_e0;
  StringPtr local_d0;
  StringPtr local_c0;
  StringPtr local_b0;
  StringPtr local_a0;
  StringPtr local_90;
  byte local_79;
  char *pcStack_78;
  char c;
  char *__end2;
  char *__begin2;
  StringPtr *__range2;
  char local_49;
  undefined1 local_48 [8];
  Vector<char> escaped;
  Impl *this_local;
  StringPtr chars_local;
  
  chars_local.content.ptr = (char *)chars.content.size_;
  this_local = (Impl *)chars.content.ptr;
  escaped.builder.disposer = (ArrayDisposer *)this;
  chars_local.content.size_ = (size_t)__return_storage_ptr__;
  sVar1 = kj::StringPtr::size((StringPtr *)&this_local);
  kj::Vector<char>::Vector((Vector<char> *)local_48,sVar1 + 3);
  local_49 = '\"';
  kj::Vector<char>::add<char>((Vector<char> *)local_48,&local_49);
  __begin2 = (char *)&this_local;
  __end2 = kj::StringPtr::begin((StringPtr *)__begin2);
  pcStack_78 = kj::StringPtr::end((StringPtr *)__begin2);
  for (; __end2 != pcStack_78; __end2 = __end2 + 1) {
    local_79 = *__end2;
    if (local_79 == 8) {
      kj::StringPtr::StringPtr(&local_b0,"\\b");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_b0);
    }
    else if (local_79 == 9) {
      kj::StringPtr::StringPtr(&local_f0,"\\t");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_f0);
    }
    else if (local_79 == 10) {
      kj::StringPtr::StringPtr(&local_d0,"\\n");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_d0);
    }
    else if (local_79 == 0xc) {
      kj::StringPtr::StringPtr(&local_c0,"\\f");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_c0);
    }
    else if (local_79 == 0xd) {
      kj::StringPtr::StringPtr(&local_e0,"\\r");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_e0);
    }
    else if (local_79 == 0x22) {
      kj::StringPtr::StringPtr(&local_90,"\\\"");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_90);
    }
    else if (local_79 == 0x5c) {
      kj::StringPtr::StringPtr(&local_a0,"\\\\");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,&local_a0);
    }
    else if (local_79 < 0x20) {
      kj::StringPtr::StringPtr((StringPtr *)local_100,"\\u00");
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_48,(StringPtr *)local_100);
      local_103[2] = local_79;
      kj::Vector<char>::add<char_const&>
                ((Vector<char> *)local_48,"0123456789abcdef" + (local_79 >> 4));
      kj::Vector<char>::add<char_const&>
                ((Vector<char> *)local_48,"0123456789abcdef" + ((byte)local_103[2] & 0xf));
    }
    else {
      kj::Vector<char>::add<char&>((Vector<char> *)local_48,(char *)&local_79);
    }
  }
  local_103[1] = 0x22;
  kj::Vector<char>::add<char>((Vector<char> *)local_48,local_103 + 1);
  local_103[0] = '\0';
  kj::Vector<char>::add<char>((Vector<char> *)local_48,local_103);
  kj::Vector<char>::releaseAsArray(&local_120,(Vector<char> *)local_48);
  kj::String::String(__return_storage_ptr__,&local_120);
  kj::Array<char>::~Array(&local_120);
  kj::Vector<char>::~Vector((Vector<char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::String encodeString(kj::StringPtr chars) const {
    static const char HEXDIGITS[] = "0123456789abcdef";
    kj::Vector<char> escaped(chars.size() + 3);

    escaped.add('"');
    for (char c: chars) {
      switch (c) {
        case '\"': escaped.addAll(kj::StringPtr("\\\"")); break;
        case '\\': escaped.addAll(kj::StringPtr("\\\\")); break;
        case '\b': escaped.addAll(kj::StringPtr("\\b")); break;
        case '\f': escaped.addAll(kj::StringPtr("\\f")); break;
        case '\n': escaped.addAll(kj::StringPtr("\\n")); break;
        case '\r': escaped.addAll(kj::StringPtr("\\r")); break;
        case '\t': escaped.addAll(kj::StringPtr("\\t")); break;
        default:
          if (static_cast<uint8_t>(c) < 0x20) {
            escaped.addAll(kj::StringPtr("\\u00"));
            uint8_t c2 = c;
            escaped.add(HEXDIGITS[c2 / 16]);
            escaped.add(HEXDIGITS[c2 % 16]);
          } else {
            escaped.add(c);
          }
          break;
      }
    }
    escaped.add('"');
    escaped.add('\0');

    return kj::String(escaped.releaseAsArray());
  }